

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.h
# Opt level: O2

bool bsplib::read_env<int>(char *str,int *result)

{
  byte bVar1;
  char *__s;
  allocator<char> local_1a9;
  string local_1a8 [32];
  istringstream s;
  byte abStack_168 [352];
  
  __s = getenv(str);
  if (__s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_1a8,__s,&local_1a9);
    std::__cxx11::istringstream::istringstream((istringstream *)&s,local_1a8,_S_in);
    std::__cxx11::string::~string(local_1a8);
    std::istream::operator>>((istream *)&s,result);
    bVar1 = abStack_168[*(long *)(_s + -0x18)];
    std::__cxx11::istringstream::~istringstream((istringstream *)&s);
    if ((bVar1 & 5) != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool read_env( const char * str, T & result ) {
#if HAS_DUPENV_S_WIN32
        char * env = NULL;
        if (_dupenv_s( &env, NULL , str) )
            return false;
#else
        const char * env = std::getenv( str );
#endif
        if (env) {
            std::istringstream s( env );
#if HAS_DUPENV_S_WIN32
            free(env);
#endif
            s >> result;
            if (!s)
                return true;
        }
        return false;
    }